

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderHasAttributes(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr pxVar2;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  iVar1 = 0;
  if (reader->node != (xmlNodePtr)0x0) {
    pxVar2 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar2 = reader->curnode;
    }
    if ((pxVar2->type != XML_ELEMENT_NODE) ||
       ((iVar1 = 1, pxVar2->properties == (_xmlAttr *)0x0 && (pxVar2->nsDef == (xmlNs *)0x0)))) {
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextReaderHasAttributes(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    if ((node->type == XML_ELEMENT_NODE) &&
	((node->properties != NULL) || (node->nsDef != NULL)))
	return(1);
    /* TODO: handle the xmlDecl */
    return(0);
}